

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nearest_neighbor.cc
# Opt level: O1

void __thiscall
features::NearestNeighbor<short>::find(NearestNeighbor<short> *this,short *query,Result *result)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  short *psVar4;
  short *psVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  
  result->index_2nd_best = 0;
  result->dist_1st_best = 0;
  result->dist_2nd_best = 0;
  result->index_1st_best = 0;
  iVar2 = *(int *)this;
  iVar3 = *(int *)(this + 4);
  iVar6 = iVar2 + 7;
  if (-1 < iVar2) {
    iVar6 = iVar2;
  }
  if (0 < iVar3) {
    psVar5 = *(short **)(this + 8);
    iVar8 = 0;
    iVar7 = 0;
    do {
      sVar10 = 0;
      sVar11 = 0;
      sVar12 = 0;
      sVar13 = 0;
      sVar14 = 0;
      sVar15 = 0;
      sVar16 = 0;
      sVar17 = 0;
      psVar4 = query;
      iVar9 = iVar6 >> 3;
      if (7 < iVar2) {
        do {
          sVar10 = sVar10 + *psVar5 * *psVar4;
          sVar11 = sVar11 + psVar5[1] * psVar4[1];
          sVar12 = sVar12 + psVar5[2] * psVar4[2];
          sVar13 = sVar13 + psVar5[3] * psVar4[3];
          sVar14 = sVar14 + psVar5[4] * psVar4[4];
          sVar15 = sVar15 + psVar5[5] * psVar4[5];
          sVar16 = sVar16 + psVar5[6] * psVar4[6];
          sVar17 = sVar17 + psVar5[7] * psVar4[7];
          psVar5 = psVar5 + 8;
          iVar9 = iVar9 + -1;
          psVar4 = psVar4 + 8;
        } while (iVar9 != 0);
      }
      iVar9 = (int)sVar17 +
              (int)sVar16 + (int)sVar15 + (int)sVar14 +
              (int)sVar13 + (int)sVar12 + (int)sVar11 + (int)sVar10;
      if ((short)iVar8 <= iVar9) {
        iVar8 = (int)result->dist_1st_best;
        if (iVar9 < iVar8) {
          result->index_2nd_best = iVar7;
          result->dist_2nd_best = (short)iVar9;
          iVar8 = iVar9;
        }
        else {
          result->index_2nd_best = result->index_1st_best;
          result->dist_2nd_best = result->dist_1st_best;
          result->index_1st_best = iVar7;
          result->dist_1st_best = (short)iVar9;
        }
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar3);
  }
  uVar1 = result->dist_1st_best;
  sVar10 = uVar1;
  if ((short)uVar1 < 1) {
    sVar10 = 0;
  }
  if (0x3f00 < sVar10) {
    sVar10 = 0x3f01;
  }
  sVar11 = 0;
  if (0 < result->dist_2nd_best) {
    sVar11 = result->dist_2nd_best;
  }
  if (0x3f00 < sVar11) {
    sVar11 = 0x3f01;
  }
  result->dist_1st_best = sVar10 * -2 + 0x7e02;
  result->dist_2nd_best = sVar11 * -2 + 0x7e02;
  return;
}

Assistant:

void
NearestNeighbor<short>::find (short const* query,
    NearestNeighbor<short>::Result* result) const
{
    /* Result distances are shamelessly misused to store inner products. */
    result->dist_1st_best = 0;
    result->dist_2nd_best = 0;
    result->index_1st_best = 0;
    result->index_2nd_best = 0;

    short_inner_prod<short>(query, result, this->elements,
        this->num_elements, this->dimensions);

    /*
     * Compute actual square distances.
     * The distance with 'signed char' vectors is: 2 * 127^2 - 2 * <Q, Ci>.
     * The maximum distance is (2*127)^2, which unfortunately does not fit
     * in a signed short. Therefore, the distance is clapmed at 127^2.
     */
    result->dist_1st_best = std::min(16129, std::max(0, (int)result->dist_1st_best));
    result->dist_2nd_best = std::min(16129, std::max(0, (int)result->dist_2nd_best));
    result->dist_1st_best = 32258 - 2 * result->dist_1st_best;
    result->dist_2nd_best = 32258 - 2 * result->dist_2nd_best;
}